

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansequence.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  undefined8 *in_RSI;
  undefined4 in_EDI;
  _Bool _Var4;
  ifreq ifr;
  int enable_canfd;
  option long_options [12];
  int opt;
  _Bool receive;
  _Bool brs;
  _Bool extended;
  char *interface;
  sockaddr_can addr;
  sigaction act;
  char local_288 [16];
  int local_278;
  undefined4 local_25c;
  undefined1 local_258 [392];
  int local_d0;
  byte local_cb;
  byte local_ca;
  byte local_c9;
  char *local_c8;
  sockaddr local_c0;
  undefined8 local_b0;
  sigaction local_a8;
  undefined8 *local_10;
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memcpy(&local_a8,&PTR_sig_handler_00104bb0,0x98);
  local_c0.sa_family = 0x1d;
  local_c0.sa_data[0] = '\0';
  local_c0.sa_data[1] = '\0';
  local_c0.sa_data[2] = '\0';
  local_c0.sa_data[3] = '\0';
  local_c0.sa_data[4] = '\0';
  local_c0.sa_data[5] = '\0';
  local_c0.sa_data[6] = '\0';
  local_c0.sa_data[7] = '\0';
  local_c0.sa_data[8] = '\0';
  local_c0.sa_data[9] = '\0';
  local_c0.sa_data[10] = '\0';
  local_c0.sa_data[0xb] = '\0';
  local_c0.sa_data[0xc] = '\0';
  local_c0.sa_data[0xd] = '\0';
  local_b0 = 0;
  local_c8 = "can0";
  local_c9 = 0;
  local_ca = 0;
  local_cb = 0;
  sigaction(2,&local_a8,(sigaction *)0x0);
  sigaction(0xf,&local_a8,(sigaction *)0x0);
  sigaction(1,&local_a8,(sigaction *)0x0);
  memcpy(local_258,&PTR_anon_var_dwarf_42_00104c50,0x180);
  _Var4 = infinite;
  while (infinite = _Var4, local_d0 = getopt_long(local_8,local_10,"efsbi:pq::rvh?",local_258),
        local_d0 != -1) {
    _Var4 = infinite;
    switch(local_d0) {
    case 0x3f:
    case 0x68:
      __xpg_basename((char *)*local_10);
      print_usage((char *)0x1014d6);
      exit(0);
    default:
      __xpg_basename((char *)*local_10);
      print_usage((char *)0x1014f5);
      exit(1);
    case 0x62:
      local_ca = 1;
      canfd = true;
      break;
    case 0x65:
      local_c9 = 1;
      break;
    case 0x66:
      canfd = true;
      break;
    case 0x69:
      uVar3 = strtoul(_optarg,(char **)0x0,0);
      filter[0].can_id = (canid_t)uVar3;
      _Var4 = infinite;
      break;
    case 0x6c:
      _Var4 = _optarg == (char *)0x0;
      if (!_Var4) {
        uVar3 = strtoul(_optarg,(char **)0x0,0);
        loopcount = (uint)uVar3;
      }
      break;
    case 0x70:
      use_poll = true;
      break;
    case 0x71:
      if (_optarg == (char *)0x0) {
        drop_until_quit = 1;
      }
      else {
        uVar3 = strtoul(_optarg,(char **)0x0,0);
        drop_until_quit = (uint)uVar3;
        _Var4 = infinite;
      }
      break;
    case 0x72:
      local_cb = 1;
      break;
    case 0x73:
      canfd_strict = true;
      break;
    case 0x76:
      verbose = verbose + 1;
    }
  }
  if (local_10[_optind] != 0) {
    local_c8 = (char *)local_10[_optind];
  }
  if ((local_c9 & 1) == 0) {
    filter[0].can_mask = 0x7ff;
    filter[0].can_id = filter[0].can_id & 0x7ff;
  }
  else {
    filter[0].can_mask = 0x1fffffff;
    filter[0].can_id = filter[0].can_id & 0x1fffffff | 0x80000000;
  }
  frame.can_id = filter[0].can_id;
  filter[0].can_mask = filter[0].can_mask | 0x80000000;
  printf("interface = %s\n",local_c8);
  s = socket(0x1d,3,1);
  if (s < 0) {
    perror("socket()");
    exit(1);
  }
  iVar1 = strcmp("any",local_c8);
  if (iVar1 != 0) {
    uVar2 = if_nametoindex(local_c8);
    local_c0.sa_data._2_4_ = uVar2;
    if (uVar2 == 0) {
      perror("if_nametoindex()");
      exit(1);
    }
  }
  iVar1 = setsockopt(s,0x65,1,(void *)0x0,0);
  if (iVar1 != 0) {
    perror("setsockopt()");
    exit(1);
  }
  if ((canfd & 1U) == 0) {
    canfd_strict = false;
  }
  else {
    local_25c = 1;
    strncpy(local_288,local_c8,0x10);
    iVar1 = ioctl(s,0x8921,local_288);
    if (iVar1 < 0) {
      perror("SIOCGIFMTU");
      exit(1);
    }
    if ((local_278 != 0x48) && (local_278 != 0x80c)) {
      printf("CAN interface is only Classical CAN capable - sorry.\n");
      exit(1);
    }
    iVar1 = setsockopt(s,0x65,5,&local_25c,4);
    if (iVar1 != 0) {
      printf("error when enabling CAN FD support\n");
      exit(1);
    }
  }
  if ((local_ca & 1) != 0) {
    frame.flags = frame.flags | 1;
  }
  iVar1 = bind(s,&local_c0,0x18);
  if (iVar1 < 0) {
    perror("bind()");
    exit(1);
  }
  if ((local_cb & 1) == 0) {
    do_send();
  }
  else {
    do_receive();
  }
  if (signal_num != 0) {
    return signal_num + 0x80;
  }
  exit(0);
}

Assistant:

int main(int argc, char **argv)
{
	struct sigaction act = {
		.sa_handler = sig_handler,
	};
	struct sockaddr_can addr = {
		.can_family = AF_CAN,
	};
	char *interface = "can0";
	bool extended = false;
	bool brs = false;
	bool receive = false;
	int opt;

	sigaction(SIGINT, &act, NULL);
	sigaction(SIGTERM, &act, NULL);
	sigaction(SIGHUP, &act, NULL);

	struct option long_options[] = {
		{ "extended", no_argument, 0, 'e' },
		{ "canfd", no_argument, 0, 'f' },
		{ "strict", no_argument, 0, 's' },
		{ "brs", no_argument, 0, 'b' },
		{ "identifier", required_argument, 0, 'i' },
		{ "loop", required_argument, 0, 'l' },
		{ "poll", no_argument, 0, 'p' },
		{ "quit", optional_argument, 0, 'q' },
		{ "receive", no_argument, 0, 'r' },
		{ "verbose", no_argument, 0, 'v' },
		{ "help", no_argument, 0, 'h' },
		{ 0, 0, 0, 0 },
	};

	while ((opt = getopt_long(argc, argv, "efsbi:pq::rvh?", long_options, NULL)) != -1) {
		switch (opt) {
		case 'e':
			extended = true;
			break;

		case 'f':
			canfd = true;
			break;

		case 's':
			canfd_strict = true;
			break;

		case 'b':
			brs = true; /* bitrate switch implies CAN-FD */
			canfd = true;
			break;

		case 'i':
			filter->can_id = strtoul(optarg, NULL, 0);
			break;

		case 'r':
			receive = true;
			break;

		case 'l':
			if (optarg) {
				loopcount = strtoul(optarg, NULL, 0);
				infinite = false;
			} else {
				infinite = true;
			}
			break;

		case 'p':
			use_poll = true;
			break;

		case 'q':
			if (optarg)
				drop_until_quit = strtoul(optarg, NULL, 0);
			else
				drop_until_quit = 1;
			break;

		case 'v':
			verbose++;
			break;

		case 'h':
		case '?':
			print_usage(basename(argv[0]));
			exit(EXIT_SUCCESS);
			break;

		default:
			print_usage(basename(argv[0]));
			exit(EXIT_FAILURE);
			break;
		}
	}

	if (argv[optind] != NULL)
		interface = argv[optind];

	if (extended) {
		filter->can_mask = CAN_EFF_MASK;
		filter->can_id &= CAN_EFF_MASK;
		filter->can_id |= CAN_EFF_FLAG;
	} else {
		filter->can_mask = CAN_SFF_MASK;
		filter->can_id &= CAN_SFF_MASK;
	}
	frame.can_id = filter->can_id;
	filter->can_mask |= CAN_EFF_FLAG;

	printf("interface = %s\n", interface);

	s = socket(AF_CAN, SOCK_RAW, CAN_RAW);
	if (s < 0) {
		perror("socket()");
		exit(EXIT_FAILURE);
	}

	if (strcmp(ANYDEV, interface)) {
		addr.can_ifindex = if_nametoindex(interface);
		if (!addr.can_ifindex) {
			perror("if_nametoindex()");
			exit(EXIT_FAILURE);
		}
	}

	/* first don't recv. any msgs */
	if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FILTER, NULL, 0)) {
		perror("setsockopt()");
		exit(EXIT_FAILURE);
	}

	if (canfd) {
		const int enable_canfd = 1;
		struct ifreq ifr;

		strncpy(ifr.ifr_name, interface, sizeof(ifr.ifr_name));

		/* check if the frame fits into the CAN netdevice */
		if (ioctl(s, SIOCGIFMTU, &ifr) < 0) {
			perror("SIOCGIFMTU");
			exit(EXIT_FAILURE);
		}

		if (ifr.ifr_mtu != CANFD_MTU && ifr.ifr_mtu != CANXL_MTU) {
			printf("CAN interface is only Classical CAN capable - sorry.\n");
			exit(EXIT_FAILURE);
		}

		/* interface is ok - try to switch the socket into CAN FD mode */
		if (setsockopt(s, SOL_CAN_RAW, CAN_RAW_FD_FRAMES, &enable_canfd, sizeof(enable_canfd))) {
			printf("error when enabling CAN FD support\n");
			exit(EXIT_FAILURE);
		}
	} else {
		canfd_strict = false;
	}

	if (brs)
		frame.flags |= CANFD_BRS;

	if (bind(s, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
		perror("bind()");
		exit(EXIT_FAILURE);
	}

	if (receive)
		do_receive();
	else
		do_send();

	if (signal_num)
		return 128 + signal_num;

	exit(EXIT_SUCCESS);
}